

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parameters.pb.cc
# Opt level: O1

size_t __thiscall CoreML::Specification::Int64Parameter::ByteSizeLong(Int64Parameter *this)

{
  int iVar1;
  long lVar2;
  uint uVar3;
  ulong uVar4;
  size_t sVar5;
  size_t sVar6;
  
  if (this->defaultvalue_ == 0) {
    sVar6 = 0;
  }
  else {
    uVar4 = this->defaultvalue_ | 1;
    lVar2 = 0x3f;
    if (uVar4 != 0) {
      for (; uVar4 >> lVar2 == 0; lVar2 = lVar2 + -1) {
      }
    }
    sVar6 = (ulong)((int)lVar2 * 9 + 0x49U >> 6) + 1;
  }
  if (this->_oneof_case_[0] == 0xb) {
    sVar5 = Int64Set::ByteSizeLong((this->AllowedValues_).set_);
  }
  else {
    if (this->_oneof_case_[0] != 10) goto LAB_0026e1cb;
    sVar5 = Int64Range::ByteSizeLong((this->AllowedValues_).range_);
  }
  uVar3 = (uint)sVar5 | 1;
  iVar1 = 0x1f;
  if (uVar3 != 0) {
    for (; uVar3 >> iVar1 == 0; iVar1 = iVar1 + -1) {
    }
  }
  sVar6 = sVar6 + sVar5 + (ulong)(iVar1 * 9 + 0x49U >> 6) + 1;
LAB_0026e1cb:
  this->_cached_size_ = (int)sVar6;
  return sVar6;
}

Assistant:

size_t Int64Parameter::ByteSizeLong() const {
// @@protoc_insertion_point(message_byte_size_start:CoreML.Specification.Int64Parameter)
  size_t total_size = 0;

  // int64 defaultValue = 1;
  if (this->defaultvalue() != 0) {
    total_size += 1 +
      ::google::protobuf::internal::WireFormatLite::Int64Size(
        this->defaultvalue());
  }

  switch (AllowedValues_case()) {
    // .CoreML.Specification.Int64Range range = 10;
    case kRange: {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *AllowedValues_.range_);
      break;
    }
    // .CoreML.Specification.Int64Set set = 11;
    case kSet: {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *AllowedValues_.set_);
      break;
    }
    case ALLOWEDVALUES_NOT_SET: {
      break;
    }
  }
  int cached_size = ::google::protobuf::internal::ToCachedSize(total_size);
  GOOGLE_SAFE_CONCURRENT_WRITES_BEGIN();
  _cached_size_ = cached_size;
  GOOGLE_SAFE_CONCURRENT_WRITES_END();
  return total_size;
}